

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<int,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToDaysOperator>
               (int *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uint uVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  ulong uVar6;
  bool bVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  idx_t iVar9;
  ulong uVar10;
  int64_t *piVar11;
  int64_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [12];
  int result;
  idx_t local_88;
  int64_t *local_80;
  idx_t local_78;
  ValidityMask *local_70;
  ulong local_68;
  ulong local_60;
  string local_58;
  int *local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_70 = mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar12 = &result_data->micros;
      iVar9 = 0;
      do {
        uVar1 = ldata[iVar9];
        bVar7 = TryCast::Operation<int,int>(uVar1,(int32_t *)&local_88,false);
        if (!bVar7) {
          auVar15 = __cxa_allocate_exception(0x10);
          CastExceptionText<int,int>(&local_58,(duckdb *)(ulong)uVar1,auVar15._8_4_);
          InvalidInputException::InvalidInputException(auVar15._0_8_,&local_58);
          __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        ((interval_t *)(piVar12 + -1))->months = (int)(local_88 << 0x20);
        ((interval_t *)(piVar12 + -1))->days = (int)((local_88 << 0x20) >> 0x20);
        *piVar12 = 0;
        iVar9 = iVar9 + 1;
        piVar12 = piVar12 + 2;
      } while (count != iVar9);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_88 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_58,(unsigned_long **)mask,&local_88);
      sVar5 = local_58._M_string_length;
      _Var4._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_60 = count + 0x3f >> 6;
      piVar12 = &result_data->micros;
      uVar10 = 0;
      local_68 = 0;
      local_80 = piVar12;
      local_78 = count;
      do {
        puVar2 = (local_70->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar14 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar14 = count;
          }
LAB_01a151d3:
          uVar6 = uVar10;
          if (uVar10 < uVar14) {
            piVar11 = piVar12 + uVar10 * 2;
            do {
              uVar1 = ldata[uVar10];
              bVar7 = TryCast::Operation<int,int>(uVar1,(int32_t *)&local_88,false);
              if (!bVar7) {
                auVar15 = __cxa_allocate_exception(0x10);
                CastExceptionText<int,int>(&local_58,(duckdb *)(ulong)uVar1,auVar15._8_4_);
                InvalidInputException::InvalidInputException(auVar15._0_8_,&local_58);
                __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              ((interval_t *)(piVar11 + -1))->months = (int)(local_88 << 0x20);
              ((interval_t *)(piVar11 + -1))->days = (int)((local_88 << 0x20) >> 0x20);
              *piVar11 = 0;
              uVar10 = uVar10 + 1;
              piVar11 = piVar11 + 2;
              uVar6 = uVar14;
              count = local_78;
            } while (uVar14 != uVar10);
          }
        }
        else {
          uVar3 = puVar2[local_68];
          uVar14 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar14 = count;
          }
          piVar12 = local_80;
          uVar6 = uVar14;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_01a151d3;
            uVar6 = uVar10;
            count = local_78;
            if (uVar10 < uVar14) {
              local_38 = ldata + uVar10;
              piVar11 = local_80 + uVar10 * 2;
              uVar13 = 0;
              do {
                if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                  uVar1 = local_38[uVar13];
                  bVar7 = TryCast::Operation<int,int>(uVar1,(int32_t *)&local_88,false);
                  if (!bVar7) {
                    auVar15 = __cxa_allocate_exception(0x10);
                    CastExceptionText<int,int>(&local_58,(duckdb *)(ulong)uVar1,auVar15._8_4_);
                    InvalidInputException::InvalidInputException(auVar15._0_8_,&local_58);
                    __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  ((interval_t *)(piVar11 + -1))->months = (int)(local_88 << 0x20);
                  ((interval_t *)(piVar11 + -1))->days = (int)((local_88 << 0x20) >> 0x20);
                  *piVar11 = 0;
                }
                uVar13 = uVar13 + 1;
                piVar11 = piVar11 + 2;
                piVar12 = local_80;
                uVar6 = uVar14;
                count = local_78;
              } while (uVar14 - uVar10 != uVar13);
            }
          }
        }
        uVar10 = uVar6;
        local_68 = local_68 + 1;
      } while (local_68 != local_60);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}